

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

mat4 * mat4_create(mat4 *__return_storage_ptr__,float a,float b,float c,float d,float e,float f,
                  float g,float h,float i,float j,float k,float l,float m,float n,float o,float p)

{
  __return_storage_ptr__->m[0] = a;
  __return_storage_ptr__->m[1] = b;
  __return_storage_ptr__->m[2] = c;
  __return_storage_ptr__->m[3] = d;
  __return_storage_ptr__->m[4] = e;
  __return_storage_ptr__->m[5] = f;
  __return_storage_ptr__->m[6] = g;
  __return_storage_ptr__->m[7] = h;
  __return_storage_ptr__->m[8] = i;
  __return_storage_ptr__->m[9] = j;
  __return_storage_ptr__->m[10] = k;
  __return_storage_ptr__->m[0xb] = l;
  __return_storage_ptr__->m[0xc] = m;
  __return_storage_ptr__->m[0xd] = n;
  __return_storage_ptr__->m[0xe] = o;
  __return_storage_ptr__->m[0xf] = p;
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_create(float a, float b, float c, float d,
        float e, float f, float g, float h,
        float i, float j, float k, float l,
        float m, float n, float o, float p) {
    mat4 mat;
    mat.m[0] = a;
    mat.m[1] = b;
    mat.m[2] = c;
    mat.m[3] = d;
    mat.m[4] = e;
    mat.m[5] = f;
    mat.m[6] = g;
    mat.m[7] = h;
    mat.m[8] = i;
    mat.m[9] = j;
    mat.m[10] = k;
    mat.m[11] = l;
    mat.m[12] = m;
    mat.m[13] = n;
    mat.m[14] = o;
    mat.m[15] = p;
    return mat;
}